

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O2

int __thiscall
QDateTimeParser::findMonth
          (QDateTimeParser *this,QStringView str,int startMonth,int sectionIndex,int year,
          QString *usedMonth,int *used)

{
  int iVar1;
  SectionNode *pSVar2;
  int month;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_1a8;
  QLocale l;
  undefined1 local_188 [336];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar2 = sectionNode(this,sectionIndex);
  if (pSVar2->type == MonthSection) {
    iVar1 = pSVar2->count;
    l.d.d.ptr = (QSharedDataPointer<QLocalePrivate>)&DAT_aaaaaaaaaaaaaaaa;
    (*this->_vptr_QDateTimeParser[6])(&l,this);
    memset(local_188 + 0x18,0xaa,0x138);
    local_188._0_4_ = 0xd;
    local_188._4_4_ = 0;
    local_188._8_4_ = 0;
    local_188._12_4_ = 0;
    local_188._16_8_ = local_188 + 0x18;
    QVarLengthArray<QString,_13LL>::reserve
              ((QVarLengthArray<QString,_13LL> *)local_188,(long)(0xd - startMonth));
    for (month = startMonth; month < 0xd; month = month + 1) {
      QCalendar::monthName((QString *)&local_1a8,&this->calendar,&l,month,year,(uint)(iVar1 == 3));
      QVarLengthArray<QString,_13LL>::emplace_back<QString>
                ((QVarLengthArray<QString,_13LL> *)local_188,(QString *)&local_1a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a8);
    }
    iVar1 = findTextEntry(str,(ShortVector<QString> *)local_188,usedMonth,used);
    if (iVar1 < 0) {
      startMonth = 0;
    }
    iVar1 = startMonth + iVar1;
    QVarLengthArray<QString,_13LL>::~QVarLengthArray((ShortVector<QString> *)local_188);
    QLocale::~QLocale(&l);
  }
  else {
    local_188._0_4_ = 2;
    local_188._20_4_ = 0;
    local_188._4_4_ = 0;
    local_188._8_4_ = 0;
    local_188._12_4_ = 0;
    local_188._16_4_ = 0;
    local_188._24_8_ = "default";
    QMessageLogger::warning((QMessageLogger *)local_188,"QDateTimeParser::findMonth Internal error")
    ;
    iVar1 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QDateTimeParser::findMonth(QStringView str, int startMonth, int sectionIndex,
                               int year, QString *usedMonth, int *used) const
{
    const SectionNode &sn = sectionNode(sectionIndex);
    if (sn.type != MonthSection) {
        qWarning("QDateTimeParser::findMonth Internal error");
        return -1;
    }

    QLocale::FormatType type = sn.count == 3 ? QLocale::ShortFormat : QLocale::LongFormat;
    QLocale l = locale();
    ShortVector<QString> monthNames;
    monthNames.reserve(13 - startMonth);
    for (int month = startMonth; month <= 12; ++month)
        monthNames.append(calendar.monthName(l, month, year, type));

    const int index = findTextEntry(str, monthNames, usedMonth, used);
    return index < 0 ? index : index + startMonth;
}